

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

void __thiscall VulkanHppGenerator::generateCppModuleFile(VulkanHppGenerator *this)

{
  long lVar1;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_27b;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_27a;
  allocator<char> local_279;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  string local_238;
  string vulkan_cppm;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,
             "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp",
             (allocator<char> *)&local_238);
  std::operator+(&str,&local_258,"/vulkan/");
  std::operator+(&local_168[0].first,&str,&this->m_api);
  std::operator+(&vulkan_cppm,&local_168[0].first,".cppm");
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::~string((string *)&local_258);
  std::operator+(&str,"VulkanHppGenerator: Generating ",&vulkan_cppm);
  std::operator+(&local_168[0].first,&str," ...\n");
  SyncedMessageHandler::message(&messager,&local_168[0].first);
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"CppModuleFileTemplate.hpp",&local_279);
  anon_unknown.dwarf_dd40c::readSnippet(&local_258,&local_238);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_true>(local_168,(char (*) [4])0x1dae69,&this->m_api);
  generateCppModuleHashSpecializations_abi_cxx11_(&local_1b8,this);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[20],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (local_168 + 1,(char (*) [20])"hashSpecializations",&local_1b8);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_true>
            (local_168 + 2,(char (*) [14])"licenseHeader",&this->m_vulkanLicenseHeader);
  generateCppModuleRaiiUsings_abi_cxx11_(&local_1d8,this);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (local_168 + 3,(char (*) [11])"raiiUsings",&local_1d8);
  generateCppModuleUsings_abi_cxx11_(&local_1f8,this);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_68,(char (*) [7])"usings",&local_1f8);
  __l._M_len = 5;
  __l._M_array = local_168;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_198,__l,&local_27a,&local_27b);
  replaceWithMap(&str,&local_258,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_198);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_198);
  lVar1 = 0x100;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&local_168[0].first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x40;
  } while (lVar1 != -0x40);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_238);
  writeToFile(&str,&vulkan_cppm);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::~string((string *)&vulkan_cppm);
  return;
}

Assistant:

void VulkanHppGenerator::generateCppModuleFile() const
{
  std::string const vulkan_cppm = std::string( BASE_PATH ) + "/vulkan/" + m_api + ".cppm";
  messager.message( "VulkanHppGenerator: Generating " + vulkan_cppm + " ...\n" );

  auto const str = replaceWithMap( readSnippet( "CppModuleFileTemplate.hpp" ),
                                   { { "api", m_api },
                                     { "hashSpecializations", generateCppModuleHashSpecializations() },
                                     { "licenseHeader", m_vulkanLicenseHeader },
                                     { "raiiUsings", generateCppModuleRaiiUsings() },
                                     { "usings", generateCppModuleUsings() } } );

  writeToFile( str, vulkan_cppm );
}